

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

string * __thiscall
pstore::file::system_error::message<char_const*>
          (string *__return_storage_ptr__,system_error *this,char **user_message,string *path)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  ostringstream stream;
  undefined1 auStack_198 [7];
  char local_191;
  long local_190 [14];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  __s = *user_message;
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,__s,sVar1);
  }
  if (path->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," \"",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(path->_M_dataplus)._M_p,path->_M_string_length);
    local_191 = '\"';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_191,1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string system_error::message (MessageStringType const & user_message,
                                           std::string const & path) {
            std::ostringstream stream;
            stream << user_message;
            if (path.length () > 0) {
                stream << " \"" << path << '\"';
            }
            return stream.str ();
        }